

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall ObjectFileDB::get_objs_from_dgo(ObjectFileDB *this,string *filename)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  size_type sVar5;
  byte *pbVar6;
  uint8_t *puVar7;
  ulong in_len;
  uchar *puVar8;
  long in_RDI;
  DgoHeader obj_header;
  uint32_t i_1;
  string dgo_base_name;
  DgoHeader header;
  BinaryReader reader;
  int lzo_rv;
  lzo_uint bytes_written;
  uint32_t chunk_size;
  size_t output_offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompressed_data;
  uint decompressed_size;
  BinaryReader compressed_reader;
  int i;
  bool is_jak2;
  char jak2_header [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dgo_data;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe90;
  uint local_14c;
  string *in_stack_fffffffffffffeb8;
  uint local_10c;
  string local_108 [32];
  uint local_e8;
  BinaryReader local_a8;
  int local_94;
  lzo_uint local_90;
  uint local_84;
  ulong local_80;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffac;
  uint8_t *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  ObjectFileDB *in_stack_ffffffffffffffc0;
  int local_34;
  char local_2d [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  read_binary_file(in_stack_fffffffffffffeb8);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
  *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + (int)sVar5;
  builtin_strncpy(local_2d,"oZlB",5);
  bVar2 = true;
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    cVar1 = local_2d[local_34];
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_28,(long)local_34);
    if ((int)cVar1 != (uint)*pbVar6) {
      bVar2 = false;
    }
  }
  if (bVar2) {
    in_stack_fffffffffffffe00 = 0x30;
    in_stack_fffffffffffffdf0 = 8;
    in_stack_fffffffffffffde8 = 8;
    iVar3 = __lzo_init_v2(0x20a0,2,4,8,4,8,8,8,8,0x30);
    if (iVar3 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                    ,0x59,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
    }
    BinaryReader::BinaryReader
              ((BinaryReader *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    BinaryReader::ffwd((BinaryReader *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                       ,in_stack_fffffffffffffdec);
    in_stack_ffffffffffffffa4 =
         BinaryReader::read<unsigned_int>
                   ((BinaryReader *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x192472);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffe10,
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_80 = 0;
    while( true ) {
      local_84 = 0;
      while (local_84 == 0) {
        local_84 = BinaryReader::read<unsigned_int>
                             ((BinaryReader *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
      if (local_84 < 0x8000) {
        puVar7 = BinaryReader::here((BinaryReader *)&stack0xffffffffffffffa8);
        in_len = (ulong)local_84;
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19253a);
        local_94 = lzo1x_decompress(puVar7,in_len,puVar8 + local_80,&local_90,(void *)0x0);
        if (local_94 != 0) {
          __assert_fail("lzo_rv == LZO_E_OK",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                        ,0x6e,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
        }
        BinaryReader::ffwd((BinaryReader *)
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           in_stack_fffffffffffffdec);
        local_80 = local_90 + local_80;
      }
      else {
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1925dd);
        puVar8 = puVar8 + local_80;
        puVar7 = BinaryReader::here((BinaryReader *)&stack0xffffffffffffffa8);
        memcpy(puVar8,puVar7,0x8000);
        BinaryReader::ffwd((BinaryReader *)
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           in_stack_fffffffffffffdec);
        local_80 = local_80 + 0x8000;
      }
      if (in_stack_ffffffffffffffa4 <= local_80) break;
      while (uVar4 = BinaryReader::get_seek((BinaryReader *)&stack0xffffffffffffffa8),
            (uVar4 & 3) != 0) {
        BinaryReader::ffwd((BinaryReader *)
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           in_stack_fffffffffffffdec);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  BinaryReader::BinaryReader
            ((BinaryReader *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  BinaryReader::read<DgoHeader>
            ((BinaryReader *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  base_name((string *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  bVar2 = std::operator==((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  if (bVar2) {
    anon_unknown.dwarf_2c862::assert_string_empty_after
              ((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffdec);
    local_10c = 0;
    while( true ) {
      if (local_e8 <= local_10c) {
        uVar4 = BinaryReader::bytes_left(&local_a8);
        if (uVar4 != 0) {
          __assert_fail("0 == reader.bytes_left()",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                        ,0x94,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
        }
        std::__cxx11::string::~string(local_108);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        return;
      }
      BinaryReader::read<DgoHeader>
                ((BinaryReader *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      uVar4 = BinaryReader::bytes_left(&local_a8);
      if (uVar4 < local_14c) break;
      anon_unknown.dwarf_2c862::assert_string_empty_after
                ((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe90,&stack0xfffffffffffffeb8,
                 (allocator *)&stack0xfffffffffffffe8f);
      BinaryReader::here(&local_a8);
      add_obj_from_dgo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,in_stack_ffffffffffffffac,
                       (string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
      BinaryReader::ffwd((BinaryReader *)
                         CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                         in_stack_fffffffffffffdec);
      local_10c = local_10c + 1;
    }
    __assert_fail("reader.bytes_left() >= obj_header.size",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                  ,0x8c,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
  }
  __assert_fail("header.name == dgo_base_name",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                ,0x86,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
}

Assistant:

void ObjectFileDB::get_objs_from_dgo(const std::string& filename) {
  auto dgo_data = read_binary_file(filename);
  stats.total_dgo_bytes += dgo_data.size();

  const char jak2_header[] = "oZlB";
  bool is_jak2 = true;
  for (int i = 0; i < 4; i++) {
    if (jak2_header[i] != dgo_data[i]) {
      is_jak2 = false;
    }
  }

  if (is_jak2) {
    if (lzo_init() != LZO_E_OK) {
      assert(false);
    }
    BinaryReader compressed_reader(dgo_data);
    // seek past oZlB
    compressed_reader.ffwd(4);
    auto decompressed_size = compressed_reader.read<uint32_t>();
    std::vector<uint8_t> decompressed_data;
    decompressed_data.resize(decompressed_size);
    size_t output_offset = 0;
    while (true) {
      // seek past alignment bytes and read the next chunk size
      uint32_t chunk_size = 0;
      while (!chunk_size) {
        chunk_size = compressed_reader.read<uint32_t>();
      }

      if (chunk_size < MAX_CHUNK_SIZE) {
        lzo_uint bytes_written;
        auto lzo_rv =
            lzo1x_decompress(compressed_reader.here(), chunk_size,
                             decompressed_data.data() + output_offset, &bytes_written, nullptr);
        assert(lzo_rv == LZO_E_OK);
        compressed_reader.ffwd(chunk_size);
        output_offset += bytes_written;
      } else {
        // nope - sometimes chunk_size is bigger than MAX, but we should still use max.
        //        assert(chunk_size == MAX_CHUNK_SIZE);
        memcpy(decompressed_data.data() + output_offset, compressed_reader.here(), MAX_CHUNK_SIZE);
        compressed_reader.ffwd(MAX_CHUNK_SIZE);
        output_offset += MAX_CHUNK_SIZE;
      }

      if (output_offset >= decompressed_size)
        break;
      while (compressed_reader.get_seek() % 4) {
        compressed_reader.ffwd(1);
      }
    }
    dgo_data = decompressed_data;
  }

  BinaryReader reader(dgo_data);
  auto header = reader.read<DgoHeader>();

  auto dgo_base_name = base_name(filename);
  assert(header.name == dgo_base_name);
  assert_string_empty_after(header.name, 60);

  // get all obj files...
  for (uint32_t i = 0; i < header.size; i++) {
    auto obj_header = reader.read<DgoHeader>();
    assert(reader.bytes_left() >= obj_header.size);
    assert_string_empty_after(obj_header.name, 60);

    add_obj_from_dgo(obj_header.name, reader.here(), obj_header.size, dgo_base_name);
    reader.ffwd(obj_header.size);
  }

  // check we're at the end
  assert(0 == reader.bytes_left());
}